

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O1

bool LoadScriptFile(int lumpnum,FileReader *lump,int numnodes,bool include,int type)

{
  FStrifeDialogueItemCheck *pFVar1;
  Node *pNVar2;
  uint uVar3;
  FTextureID FVar4;
  int iVar5;
  char *pcVar6;
  FStrifeDialogueNode *pFVar7;
  Node *pNVar8;
  Node *pNVar9;
  PClassActor *pPVar10;
  PClassInventory *pPVar11;
  Node *pNVar12;
  int iVar13;
  Response *responses;
  FName *buffer_00;
  long lVar14;
  bool bVar15;
  char buffer [4];
  uint local_644;
  char local_640;
  char local_63f;
  char local_63e;
  char local_63d;
  int local_63c;
  FName local_638 [7];
  uint local_61c;
  uint local_618;
  uint local_614;
  char local_610 [8];
  int local_608;
  char local_604 [4];
  char local_600 [12];
  undefined1 local_5f4 [8];
  char local_5ec [8];
  char local_5e4 [292];
  undefined1 local_4c0 [1168];
  
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_640,4);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0xfffffffffffffffc,1);
  bVar15 = true;
  if (((local_640 != '\0') && (local_63f != '\0')) && (local_63e != '\0')) {
    bVar15 = local_63d == '\0';
  }
  if ((bool)(type == 2 & bVar15 | (bVar15 ^ 1U) & type == 1)) goto LAB_003e5e75;
  if (bVar15) {
    if (!include) {
      LoadScriptFile("SCRIPT00",true,1);
    }
    if (((byte)gameinfo.flags & 2) == 0) {
      if ((numnodes * 0x12e9b5b3 + 0x567584U >> 2 | numnodes * -0x40000000) < 0x2b3ac3) {
        local_63c = 0x5ec;
LAB_003e5f27:
        local_63c = numnodes / local_63c;
        if (local_63c < 1) {
          return true;
        }
        iVar13 = 0;
        local_644 = 0;
        do {
          if (((byte)gameinfo.flags & 2) == 0) {
            pFVar7 = (FStrifeDialogueNode *)operator_new(0x50);
            (pFVar7->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
            (pFVar7->ItemCheck).Most = 0;
            (pFVar7->ItemCheck).Count = 0;
            (pFVar7->SpeakerVoice).ID = 0;
            pFVar7->Goodbye = (char *)0x0;
            (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5ec);
            pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_61c);
            do {
              pNVar12 = pNVar2;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar2 = pNVar12->Next;
            } while ((pNVar12->Pair).Key != local_61c);
            if (pNVar12 == (Node *)0x0) {
              pPVar10 = (PClassActor *)0x0;
            }
            else {
              pPVar10 = (pNVar12->Pair).Value;
            }
            pFVar7->SpeakerType = pPVar10;
            uVar3 = StrifeDialogues.Count;
            if ((-1 < (int)local_61c) && (local_644 != local_61c)) {
              if (pPVar10 != (PClassActor *)0x0) {
                local_638[0].Index =
                     (pPVar10->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                     TypeName.Index;
                pNVar8 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
                                   (&ClassRoots,local_638);
                (pNVar8->Pair).Value = uVar3;
              }
              uVar3 = StrifeDialogues.Count;
              pNVar9 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                                 (&DialogueRoots,local_61c);
              (pNVar9->Pair).Value = uVar3;
              local_644 = local_61c;
            }
            pcVar6 = ncopystring(local_5e4);
            pFVar7->Dialogue = pcVar6;
            local_5e4[0] = '\0';
            FVar4 = FTextureManager::CheckForTexture(&TexMan,local_5ec,8,1);
            (pFVar7->Backdrop).texnum = FVar4.texnum;
            local_5ec[0] = '\0';
            mysnprintf((char *)local_638,0x10,"svox/%s",local_5f4);
            iVar5 = S_FindSound((char *)local_638);
            (pFVar7->SpeakerVoice).ID = iVar5;
            local_5f4[0] = 0;
            pcVar6 = ncopystring(local_604);
            pFVar7->SpeakerName = pcVar6;
            pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_618);
            do {
              pNVar12 = pNVar2;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar2 = pNVar12->Next;
            } while ((pNVar12->Pair).Key != local_618);
            if (pNVar12 == (Node *)0x0) {
              pPVar10 = (PClassActor *)0x0;
            }
            else {
              pPVar10 = (pNVar12->Pair).Value;
            }
            pPVar10 = dyn_cast<PClassActor>((DObject *)pPVar10);
            pFVar7->DropType = pPVar10;
            TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Resize(&pFVar7->ItemCheck,3)
            ;
            lVar14 = 0;
            do {
              pNVar2 = StrifeTypes.Nodes +
                       (StrifeTypes.Size - 1 & *(uint *)(local_610 + lVar14 * 4 + -4));
              do {
                pNVar12 = pNVar2;
                if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                  pNVar12 = (Node *)0x0;
                  break;
                }
                pNVar2 = pNVar12->Next;
              } while ((pNVar12->Pair).Key != *(uint *)(local_610 + lVar14 * 4 + -4));
              if (pNVar12 == (Node *)0x0) {
                pPVar10 = (PClassActor *)0x0;
              }
              else {
                pPVar10 = (pNVar12->Pair).Value;
              }
              pPVar11 = dyn_cast<PClassInventory>((DObject *)pPVar10);
              pFVar1 = (pFVar7->ItemCheck).Array;
              pFVar1[lVar14].Item = pPVar11;
              pFVar1[lVar14].Amount = -1;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            pFVar7->ItemCheckNode = local_608;
            pFVar7->Children = (FStrifeDialogueReply *)0x0;
            responses = (Response *)(local_4c0 + 0x1c);
          }
          else {
            pFVar7 = (FStrifeDialogueNode *)operator_new(0x50);
            (pFVar7->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
            (pFVar7->ItemCheck).Most = 0;
            (pFVar7->ItemCheck).Count = 0;
            (pFVar7->SpeakerVoice).ID = 0;
            pFVar7->Goodbye = (char *)0x0;
            (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,&local_61c,0x5d0);
            pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_61c);
            do {
              pNVar12 = pNVar2;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar2 = pNVar12->Next;
            } while ((pNVar12->Pair).Key != local_61c);
            if (pNVar12 == (Node *)0x0) {
              pPVar10 = (PClassActor *)0x0;
            }
            else {
              pPVar10 = (pNVar12->Pair).Value;
            }
            pFVar7->SpeakerType = pPVar10;
            uVar3 = StrifeDialogues.Count;
            if ((-1 < (int)local_61c) && (local_644 != local_61c)) {
              if (pPVar10 != (PClassActor *)0x0) {
                local_638[0].Index =
                     (pPVar10->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                     TypeName.Index;
                pNVar8 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
                                   (&ClassRoots,local_638);
                (pNVar8->Pair).Value = uVar3;
              }
              uVar3 = StrifeDialogues.Count;
              pNVar9 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode
                                 (&DialogueRoots,local_61c);
              (pNVar9->Pair).Value = uVar3;
              local_644 = local_61c;
            }
            pcVar6 = ncopystring(local_600);
            pFVar7->Dialogue = pcVar6;
            (pFVar7->Backdrop).texnum = -1;
            if (local_614 == 0) {
              buffer_00 = (FName *)0x0;
            }
            else {
              buffer_00 = local_638;
              mysnprintf((char *)buffer_00,0x10,"svox/voc%u");
            }
            iVar5 = S_FindSound((char *)buffer_00);
            (pFVar7->SpeakerVoice).ID = iVar5;
            local_600[0] = '\0';
            pcVar6 = ncopystring(local_610);
            pFVar7->SpeakerName = pcVar6;
            pNVar2 = StrifeTypes.Nodes + (StrifeTypes.Size - 1 & local_618);
            do {
              pNVar12 = pNVar2;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar2 = pNVar12->Next;
            } while ((pNVar12->Pair).Key != local_618);
            if (pNVar12 == (Node *)0x0) {
              pPVar10 = (PClassActor *)0x0;
            }
            else {
              pPVar10 = (pNVar12->Pair).Value;
            }
            pPVar10 = dyn_cast<PClassActor>((DObject *)pPVar10);
            pFVar7->DropType = pPVar10;
            TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Resize(&pFVar7->ItemCheck,3)
            ;
            pFVar1 = (pFVar7->ItemCheck).Array;
            lVar14 = 8;
            do {
              *(undefined8 *)((long)pFVar1 + lVar14 + -8) = 0;
              *(undefined4 *)((long)&pFVar1->Item + lVar14) = 0xffffffff;
              lVar14 = lVar14 + 0x10;
            } while (lVar14 != 0x38);
            pFVar7->ItemCheckNode = 0;
            pFVar7->Children = (FStrifeDialogueReply *)0x0;
            responses = (Response *)local_4c0;
          }
          ParseReplies(&pFVar7->Children,responses);
          TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Grow(&StrifeDialogues,1);
          StrifeDialogues.Array[StrifeDialogues.Count] = pFVar7;
          uVar3 = StrifeDialogues.Count + 1;
          pFVar7->ThisNodeNum = StrifeDialogues.Count;
          StrifeDialogues.Count = uVar3;
          iVar13 = iVar13 + 1;
        } while (iVar13 != local_63c);
        goto LAB_003e5ef2;
      }
    }
    else if ((numnodes * 0x3f4fd3f5 + 0x1605810U >> 4 | numnodes * 0x50000000) < 0x2c0b03) {
      local_63c = 0x5d0;
      goto LAB_003e5f27;
    }
LAB_003e5e75:
    pcVar6 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
    bVar15 = false;
    DPrintf(1,"Incorrect data format for conversation script in %s.\n",pcVar6);
  }
  else {
    P_ParseUSDF(lumpnum,lump,numnodes);
LAB_003e5ef2:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

static bool LoadScriptFile(int lumpnum, FileReader *lump, int numnodes, bool include, int type)
{
	int i;
	DWORD prevSpeakerType;
	FStrifeDialogueNode *node;
	char buffer[4];

	lump->Read(buffer, 4);
	lump->Seek(-4, SEEK_CUR);

	// The binary format is so primitive that this check is enough to detect it.
	bool isbinary = (buffer[0] == 0 || buffer[1] == 0 || buffer[2] == 0 || buffer[3] == 0);

	if ((type == 1 && !isbinary) || (type == 2 && isbinary))
	{
		DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
		return false;
	}

	if (!isbinary)
	{
		P_ParseUSDF(lumpnum, lump, numnodes);
	}
	else 
	{
		if (!include)
		{
			LoadScriptFile("SCRIPT00", true, 1);
		}
		if (!(gameinfo.flags & GI_SHAREWARE))
		{
			// Strife scripts are always a multiple of 1516 bytes because each entry
			// is exactly 1516 bytes long.
			if (numnodes % 1516 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1516;
		}
		else
		{
			// And the teaser version has 1488-byte entries.
			if (numnodes % 1488 != 0)
			{
				DPrintf(DMSG_ERROR, "Incorrect data format for conversation script in %s.\n", Wads.GetLumpFullName(lumpnum));
				return false;
			}
			numnodes /= 1488;
		}

		prevSpeakerType = 0;

		for (i = 0; i < numnodes; ++i)
		{
			if (!(gameinfo.flags & GI_SHAREWARE))
			{
				node = ReadRetailNode (lump, prevSpeakerType);
			}
			else
			{
				node = ReadTeaserNode (lump, prevSpeakerType);
			}
			node->ThisNodeNum = StrifeDialogues.Push(node);
		}
	}
	return true;
}